

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O0

uint8_t * __thiscall
MPEGSequenceHeader::deserializeExtension(MPEGSequenceHeader *this,BitStreamReader *bitReader)

{
  char cVar1;
  bool bVar2;
  uchar uVar3;
  byte bVar4;
  uint16_t uVar5;
  uint uVar6;
  uint8_t *puVar7;
  BitStreamReader *bitReader_local;
  MPEGSequenceHeader *this_local;
  
  BitStreamReader::skipBit(bitReader);
  cVar1 = BitStreamReader::getBits<signed_char>(bitReader,3);
  this->profile = cVar1;
  cVar1 = BitStreamReader::getBits<signed_char>(bitReader,4);
  this->level = cVar1;
  bVar2 = BitStreamReader::getBit(bitReader);
  this->progressive_sequence = bVar2;
  uVar3 = BitStreamReader::getBits<unsigned_char>(bitReader,2);
  this->chroma_format = uVar3;
  uVar3 = BitStreamReader::getBits<unsigned_char>(bitReader,2);
  this->horiz_size_ext = uVar3;
  uVar3 = BitStreamReader::getBits<unsigned_char>(bitReader,2);
  this->vert_size_ext = uVar3;
  *(ushort *)&(this->super_MPEGRawDataHeader).field_0x1c =
       *(ushort *)&(this->super_MPEGRawDataHeader).field_0x1c | (ushort)this->horiz_size_ext << 0xc;
  *(ushort *)&(this->super_MPEGRawDataHeader).field_0x1e =
       *(ushort *)&(this->super_MPEGRawDataHeader).field_0x1e | (ushort)this->vert_size_ext << 0xc;
  uVar5 = BitStreamReader::getBits<short>(bitReader,0xc);
  this->bit_rate_ext = uVar5;
  this->bit_rate = (uint)this->bit_rate_ext * 0x6400000 + this->bit_rate;
  BitStreamReader::skipBit(bitReader);
  uVar6 = BitStreamReader::getBits(bitReader,8);
  this->rc_buffer_size = uVar6 * 0x1000000 + this->rc_buffer_size;
  bVar2 = BitStreamReader::getBit(bitReader);
  this->low_delay = bVar2;
  bVar4 = BitStreamReader::getBits<unsigned_char>(bitReader,2);
  (this->frame_rate_ext).num = bVar4 + 1;
  bVar4 = BitStreamReader::getBits<unsigned_char>(bitReader,5);
  (this->frame_rate_ext).den = bVar4 + 1;
  puVar7 = MPEGHeader::skipProcessedBytes(bitReader);
  return puVar7;
}

Assistant:

uint8_t* MPEGSequenceHeader::deserializeExtension(BitStreamReader& bitReader)
{
    bitReader.skipBit(); /* profile and level esc*/
    profile = bitReader.getBits<int8_t>(3);
    level = bitReader.getBits<int8_t>(4);

    progressive_sequence = bitReader.getBit();     /* progressive_sequence */
    chroma_format = bitReader.getBits<uint8_t>(2); /* chroma_format 1=420, 2=422, 3=444 */

    horiz_size_ext = bitReader.getBits<uint8_t>(2);
    vert_size_ext = bitReader.getBits<uint8_t>(2);
    width |= horiz_size_ext << 12;
    height |= vert_size_ext << 12;

    bit_rate_ext = bitReader.getBits<int16_t>(12); /* XXX: handle it */
    bit_rate += (bit_rate_ext << 18) * 400;

    bitReader.skipBit();  // marker

    rc_buffer_size += bitReader.getBits(8) * 1024 * 16 << 10;

    low_delay = bitReader.getBit();  // disable b-frame if true
    frame_rate_ext.num = bitReader.getBits<uint8_t>(2) + 1;
    frame_rate_ext.den = bitReader.getBits<uint8_t>(5) + 1;

    // return bitContext.buffer_ptr;
    return skipProcessedBytes(bitReader);
}